

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

unsigned_long crc32_big(unsigned_long crc,uchar *buf,uint len)

{
  byte *pbVar1;
  uint uVar2;
  byte *local_28;
  u4 *buf4;
  u4 c;
  uint len_local;
  uchar *buf_local;
  unsigned_long crc_local;
  
  buf4._0_4_ = ((uint)(crc >> 0x18) & 0xff) + ((uint)(crc >> 8) & 0xff00) +
               ((uint)crc & 0xff00) * 0x100 + (uint)crc * 0x1000000 ^ 0xffffffff;
  _c = buf;
  for (buf4._4_4_ = len; buf4._4_4_ != 0 && ((ulong)_c & 3) != 0; buf4._4_4_ = buf4._4_4_ - 1) {
    buf4._0_4_ = (uint)crc_table[4][(uint)buf4 >> 0x18 ^ (uint)*_c] ^ (uint)buf4 << 8;
    _c = _c + 1;
  }
  local_28 = _c + -4;
  for (; 0x1f < buf4._4_4_; buf4._4_4_ = buf4._4_4_ - 0x20) {
    uVar2 = *(uint *)(local_28 + 4) ^ (uint)buf4;
    uVar2 = *(uint *)(local_28 + 8) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0xc) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0x10) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0x14) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0x18) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0x1c) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    uVar2 = *(uint *)(local_28 + 0x20) ^
            (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
            (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    buf4._0_4_ = (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
                 (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    local_28 = local_28 + 0x20;
  }
  for (; 3 < buf4._4_4_; buf4._4_4_ = buf4._4_4_ - 4) {
    uVar2 = *(uint *)(local_28 + 4) ^ (uint)buf4;
    buf4._0_4_ = (uint)crc_table[4][uVar2 & 0xff] ^ (uint)crc_table[5][uVar2 >> 8 & 0xff] ^
                 (uint)crc_table[6][uVar2 >> 0x10 & 0xff] ^ (uint)crc_table[7][uVar2 >> 0x18];
    local_28 = local_28 + 4;
  }
  pbVar1 = local_28 + 4;
  for (; buf4._4_4_ != 0; buf4._4_4_ = buf4._4_4_ - 1) {
    buf4._0_4_ = (uint)crc_table[4][(uint)buf4 >> 0x18 ^ (uint)*pbVar1] ^ (uint)buf4 << 8;
    pbVar1 = pbVar1 + 1;
  }
  uVar2 = (uint)buf4 ^ 0xffffffff;
  return (ulong)((uVar2 >> 0x18) + (uVar2 >> 8 & 0xff00) + (uVar2 & 0xff00) * 0x100 +
                uVar2 * 0x1000000);
}

Assistant:

local unsigned long crc32_big(unsigned long crc, const unsigned char FAR *buf, unsigned len)
{
    register u4 c;
    register const u4 FAR *buf4;

    c = REV((u4)crc);
    c = ~c;
    while (len && ((ptrdiff_t)buf & 3)) {
        c = crc_table[4][(c >> 24) ^ *buf++] ^ (c << 8);
        len--;
    }

    buf4 = (const u4 FAR *)(const void FAR *)buf;
    buf4--;
    while (len >= 32) {
        DOBIG32;
        len -= 32;
    }
    while (len >= 4) {
        DOBIG4;
        len -= 4;
    }
    buf4++;
    buf = (const unsigned char FAR *)buf4;

    if (len) do {
        c = crc_table[4][(c >> 24) ^ *buf++] ^ (c << 8);
    } while (--len);
    c = ~c;
    return (unsigned long)(REV(c));
}